

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satIO.cpp
# Opt level: O2

bool write_exp_to_file(expression *exp,string *filename,bool terminal)

{
  int iVar1;
  ostream *poVar2;
  undefined7 in_register_00000011;
  string exp_as_string;
  ofstream outputfile;
  int aiStack_1f0 [120];
  
  mathCore::as_string_abi_cxx11_
            (&exp_as_string,(mathCore *)exp,(expression *)CONCAT71(in_register_00000011,terminal));
  if ((int)(expression *)CONCAT71(in_register_00000011,terminal) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"\n\n\nOutputExpression:\n");
    poVar2 = std::operator<<(poVar2,(string *)&exp_as_string);
    std::operator<<(poVar2,"\n\n\n");
  }
  std::ofstream::ofstream(&outputfile,(string *)filename,_S_out|_S_app);
  poVar2 = std::operator<<((ostream *)&outputfile,(string *)&exp_as_string);
  std::operator<<(poVar2,"\n\n\n");
  iVar1 = *(int *)((long)aiStack_1f0 + *(long *)(_outputfile + -0x18));
  std::ofstream::close();
  std::ofstream::~ofstream(&outputfile);
  std::__cxx11::string::~string((string *)&exp_as_string);
  return iVar1 == 0;
}

Assistant:

bool write_exp_to_file(expression* exp, std::string& filename, bool terminal) {
  std::string exp_as_string = mathCore::as_string(exp);
  bool success;

  if (terminal) {
    std::cout << "\n\n\nOutputExpression:\n" << exp_as_string << "\n\n\n";
  }

  std::ofstream outputfile(filename, std::ios::out | std::ios::app);
  outputfile << exp_as_string << "\n\n\n";
  success = outputfile.good();
  outputfile.close();
  return success;
}